

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5IndexClose(Fts5Index *p)

{
  Fts5Hash *pHash;
  int in_EAX;
  int extraout_EAX;
  
  if (p != (Fts5Index *)0x0) {
    if (p->pStruct != (Fts5Structure *)0x0) {
      fts5StructureRelease(p->pStruct);
      p->pStruct = (Fts5Structure *)0x0;
    }
    sqlite3_finalize(p->pWriter);
    sqlite3_finalize(p->pDeleter);
    sqlite3_finalize(p->pIdxWriter);
    sqlite3_finalize(p->pIdxDeleter);
    sqlite3_finalize(p->pIdxSelect);
    sqlite3_finalize(p->pIdxNextSelect);
    sqlite3_finalize(p->pDataVersion);
    sqlite3_finalize(p->pDeleteFromIdx);
    pHash = p->pHash;
    if (pHash != (Fts5Hash *)0x0) {
      sqlite3Fts5HashClear(pHash);
      sqlite3_free(pHash->aSlot);
      sqlite3_free(pHash);
    }
    sqlite3_free(p->zDataTbl);
    sqlite3_free(p);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int sqlite3Fts5IndexClose(Fts5Index *p){
  int rc = SQLITE_OK;
  if( p ){
    assert( p->pReader==0 );
    fts5StructureInvalidate(p);
    sqlite3_finalize(p->pWriter);
    sqlite3_finalize(p->pDeleter);
    sqlite3_finalize(p->pIdxWriter);
    sqlite3_finalize(p->pIdxDeleter);
    sqlite3_finalize(p->pIdxSelect);
    sqlite3_finalize(p->pIdxNextSelect);
    sqlite3_finalize(p->pDataVersion);
    sqlite3_finalize(p->pDeleteFromIdx);
    sqlite3Fts5HashFree(p->pHash);
    sqlite3_free(p->zDataTbl);
    sqlite3_free(p);
  }
  return rc;
}